

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O1

RecyclableObject * __thiscall Js::JavascriptProxy::GetHandler(JavascriptProxy *this)

{
  bool bVar1;
  
  bVar1 = IsRevoked(this);
  if (!bVar1) {
    return (this->handler).ptr;
  }
  JavascriptError::ThrowTypeError
            ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ea15,L"");
}

Assistant:

RecyclableObject* JavascriptProxy::GetHandler()
    {
        if (IsRevoked())
        {
            JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_ErrorOnRevokedProxy, _u(""));
        }
        return handler;
    }